

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void compile_limits(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *limits,uint32_t *dest,bool quiet)

{
  char cVar1;
  pointer pbVar2;
  uint32_t uVar3;
  size_t j;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  string limit;
  char *local_50;
  long local_48;
  
  for (uVar6 = 0;
      pbVar2 = (limits->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(limits->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar6 = uVar6 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)(pbVar2 + uVar6));
    cVar1 = *local_50;
    if ((int)cVar1 - 0x30U < 10) {
      uVar3 = atoi(local_50);
      if (!quiet) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"limiting to ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
        poVar4 = std::operator<<(poVar4,"features for each namespace.");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
        dest[lVar5] = uVar3;
      }
    }
    else if (local_48 == 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "You must specify the namespace index before the n");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      uVar3 = atoi(local_50 + 1);
      dest[(uint)(int)cVar1] = uVar3;
      if (!quiet) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"limiting to ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
        poVar4 = std::operator<<(poVar4," for namespaces ");
        poVar4 = std::operator<<(poVar4,*local_50);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void compile_limits(vector<string> limits, uint32_t* dest, bool quiet)
{
  for (size_t i = 0; i < limits.size(); i++)
  {
    string limit = limits[i];
    if (isdigit(limit[0]))
    {
      int n = atoi(limit.c_str());
      if (!quiet)
        cerr << "limiting to " << n << "features for each namespace." << endl;
      for (size_t j = 0; j < 256; j++) dest[j] = n;
    }
    else if (limit.size() == 1)
      cout << "You must specify the namespace index before the n" << endl;
    else
    {
      int n = atoi(limit.c_str() + 1);
      dest[(uint32_t)limit[0]] = n;
      if (!quiet)
        cerr << "limiting to " << n << " for namespaces " << limit[0] << endl;
    }
  }
}